

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_polynomial_model.hpp
# Opt level: O2

Polynomial<int,_double> * __thiscall
cimod::BinaryPolynomialModel<int,_double>::GetPolynomial
          (Polynomial<int,_double> *__return_storage_ptr__,BinaryPolynomialModel<int,_double> *this)

{
  mapped_type mVar1;
  pointer pvVar2;
  mapped_type *pmVar3;
  size_t i;
  ulong uVar4;
  long lVar5;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  lVar5 = 0;
  for (uVar4 = 0;
      pvVar2 = (this->poly_key_list_).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)(((long)(this->poly_key_list_).
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0x18);
      uVar4 = uVar4 + 1) {
    mVar1 = (this->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar4];
    pmVar3 = std::__detail::
             _Map_base<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)__return_storage_ptr__,
                          (key_type *)
                          ((long)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data + lVar5));
    *pmVar3 = mVar1;
    lVar5 = lVar5 + 0x18;
  }
  return __return_storage_ptr__;
}

Assistant:

Polynomial<IndexType, FloatType> GetPolynomial() const {
      Polynomial<IndexType, FloatType> poly_map;
      for ( std::size_t i = 0; i < poly_key_list_.size(); ++i ) {
        poly_map[ poly_key_list_[ i ] ] = poly_value_list_[ i ];
      }
      return poly_map;
    }